

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

bool google::protobuf::internal::WireFormatLite::SkipField(CodedInputStream *input,uint32_t tag)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  byte *pbVar4;
  ulong uVar5;
  int iVar6;
  uint32_t first_byte_or_zero;
  pair<unsigned_long,_bool> pVar8;
  uint32_t local_1c;
  uint64_t local_18;
  byte *pbVar7;
  
  if (tag < 8) {
LAB_0017525f:
    bVar3 = 0;
  }
  else {
    bVar3 = 0;
    switch(tag & 7) {
    case 0:
      pcVar1 = *(char **)input;
      if ((*(char **)(input + 8) <= pcVar1) || (*pcVar1 < '\0')) {
        pVar8 = io::CodedInputStream::ReadVarint64Fallback(input);
        bVar3 = pVar8.second;
        goto switchD_00175289_caseD_4;
      }
      pbVar4 = (byte *)(pcVar1 + 1);
      break;
    case 1:
      if (*(int *)(input + 8) - (int)*(long *)input < 8) {
        bVar3 = io::CodedInputStream::ReadLittleEndian64Fallback(input,&local_18);
        goto switchD_00175289_caseD_4;
      }
      pbVar4 = (byte *)(*(long *)input + 8);
      break;
    case 2:
      pbVar4 = *(byte **)input;
      pbVar7 = *(byte **)(input + 8);
      if (pbVar4 < pbVar7) {
        bVar3 = *pbVar4;
        uVar5 = (ulong)bVar3;
        first_byte_or_zero = (uint32_t)bVar3;
        if ((char)bVar3 < '\0') goto LAB_00175366;
        pbVar4 = pbVar4 + 1;
        *(byte **)input = pbVar4;
      }
      else {
        first_byte_or_zero = 0;
LAB_00175366:
        uVar5 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
        if ((uVar5 & 0x8000000080000000) != 0) goto LAB_0017525f;
        pbVar4 = *(byte **)input;
        pbVar7 = *(byte **)(input + 8);
      }
      iVar6 = (int)pbVar7 - (int)pbVar4;
      if (iVar6 < (int)uVar5) {
        bVar2 = io::CodedInputStream::SkipFallback(input,(int)uVar5,iVar6);
        return bVar2;
      }
      pbVar4 = pbVar4 + (uVar5 & 0xffffffff);
      break;
    case 3:
      iVar6 = *(int *)(input + 0x34);
      *(int *)(input + 0x34) = iVar6 + -1;
      if ((0 < iVar6) && (bVar2 = SkipMessage(input), bVar2)) {
        if (*(int *)(input + 0x34) < *(int *)(input + 0x38)) {
          *(int *)(input + 0x34) = *(int *)(input + 0x34) + 1;
        }
        bVar3 = *(uint *)(input + 0x20) == (tag & 0xfffffff8 | 4);
        goto switchD_00175289_caseD_4;
      }
      goto LAB_0017525f;
    default:
      goto switchD_00175289_caseD_4;
    case 5:
      if (*(int *)(input + 8) - (int)*(long *)input < 4) {
        bVar3 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_1c);
        goto switchD_00175289_caseD_4;
      }
      pbVar4 = (byte *)(*(long *)input + 4);
    }
    *(byte **)input = pbVar4;
    bVar3 = 1;
  }
switchD_00175289_caseD_4:
  return (bool)(bVar3 & 1);
}

Assistant:

bool WireFormatLite::SkipField(io::CodedInputStream* input, uint32_t tag) {
  // Field number 0 is illegal.
  if (WireFormatLite::GetTagFieldNumber(tag) == 0) return false;
  switch (WireFormatLite::GetTagWireType(tag)) {
    case WireFormatLite::WIRETYPE_VARINT: {
      uint64_t value;
      if (!input->ReadVarint64(&value)) return false;
      return true;
    }
    case WireFormatLite::WIRETYPE_FIXED64: {
      uint64_t value;
      if (!input->ReadLittleEndian64(&value)) return false;
      return true;
    }
    case WireFormatLite::WIRETYPE_LENGTH_DELIMITED: {
      uint32_t length;
      if (!input->ReadVarint32(&length)) return false;
      if (!input->Skip(length)) return false;
      return true;
    }
    case WireFormatLite::WIRETYPE_START_GROUP: {
      if (!input->IncrementRecursionDepth()) return false;
      if (!SkipMessage(input)) return false;
      input->DecrementRecursionDepth();
      // Check that the ending tag matched the starting tag.
      if (!input->LastTagWas(
              WireFormatLite::MakeTag(WireFormatLite::GetTagFieldNumber(tag),
                                      WireFormatLite::WIRETYPE_END_GROUP))) {
        return false;
      }
      return true;
    }
    case WireFormatLite::WIRETYPE_END_GROUP: {
      return false;
    }
    case WireFormatLite::WIRETYPE_FIXED32: {
      uint32_t value;
      if (!input->ReadLittleEndian32(&value)) return false;
      return true;
    }
    default: {
      return false;
    }
  }
}